

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_lost_clipboard_ownership(Terminal *term,wchar_t clipboard)

{
  if ((L'\x01' < term->n_mouse_select_clipboards) && (term->mouse_select_clipboards[1] == clipboard)
     ) {
    term->selstate = LEXICOGRAPHIC;
    (term->selstart).y = L'\0';
    (term->selstart).x = L'\0';
    (term->selend).y = L'\0';
    (term->selend).x = L'\0';
    term_update(term);
    term_out(term,false);
    return;
  }
  return;
}

Assistant:

void term_lost_clipboard_ownership(Terminal *term, int clipboard)
{
    if (!(term->n_mouse_select_clipboards > 1 &&
          clipboard == term->mouse_select_clipboards[1]))
        return;

    deselect(term);
    term_update(term);

    /*
     * Since terminal output is suppressed during drag-selects, we
     * should make sure to write any pending output if one has just
     * finished.
     */
    term_out(term, false);
}